

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

void __thiscall libtorrent::aux::session_impl::update_user_agent(session_impl *this)

{
  string *psVar1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  string agent;
  undefined1 local_51;
  char *local_50;
  long local_48;
  string local_30;
  
  psVar1 = session_settings::get_str_abi_cxx11_(&this->m_settings,0);
  ::std::__cxx11::string::string((string *)&local_50,(string *)psVar1);
  _Var2._M_current = local_50;
  while( true ) {
    local_51 = 10;
    _Var2 = ::std::
            __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      (_Var2._M_current,local_50 + local_48,&local_51);
    if (_Var2._M_current == local_50 + local_48) break;
    *_Var2._M_current = ' ';
  }
  ::std::__cxx11::string::string((string *)&local_30,(string *)&local_50);
  session_settings::set_str(&this->m_settings,0,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  ::std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void session_impl::update_user_agent()
	{
		// replace all occurrences of '\n' with ' '.
		std::string agent = m_settings.get_str(settings_pack::user_agent);
		std::string::iterator i = agent.begin();
		while ((i = std::find(i, agent.end(), '\n'))
			!= agent.end())
			*i = ' ';
		m_settings.set_str(settings_pack::user_agent, agent);
	}